

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

size_t __thiscall Memory::HeapInfo::GetUsedBytes(HeapInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  
  sVar4 = (this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
          usedBytes;
  if ((sVar4 != 0 & DAT_0145c43e) == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x87c,"(recyclerPageAllocator.usedBytes == 0)",
                       "recyclerPageAllocator.usedBytes == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    sVar4 = (this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
            usedBytes;
  }
  return sVar4 + (this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.
                 super_PageAllocator.usedBytes +
         (this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator.
         super_PageAllocator.usedBytes +
         (this->recyclerLeafPageAllocator->super_PageAllocator).usedBytes;
}

Assistant:

size_t
HeapInfo::GetUsedBytes()
{
#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        Assert(recyclerPageAllocator.usedBytes == 0);
    }
#endif

    size_t usedBytes = 0;
    ForEachPageAllocator([&](IdleDecommitPageAllocator * pageAlloc)
    {
        usedBytes += pageAlloc->usedBytes;
    });
    return usedBytes;
}